

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

double __thiscall Company::averageEfficiency(Company *this)

{
  int iVar1;
  int i;
  long lVar2;
  double dVar3;
  double local_18;
  
  local_18 = 0.0;
  lVar2 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= lVar2) break;
    dVar3 = Employee::efficiency(this->employees[lVar2]);
    local_18 = local_18 + dVar3;
    lVar2 = lVar2 + 1;
  }
  iVar1 = Boss::getNumberOfEmployees(this->boss);
  return local_18 / (double)iVar1;
}

Assistant:

double Company::averageEfficiency() {
    double average = 0;
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        average += employees[i]->efficiency();
    }
    average /= (boss->getNumberOfEmployees());
    return average;
}